

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis.cpp
# Opt level: O3

SENode * __thiscall
spvtools::opt::ScalarEvolutionAnalysis::BuildGraphWithoutRecurrentTerm
          (ScalarEvolutionAnalysis *this,SENode *node,Loop *loop)

{
  pointer ppSVar1;
  iterator iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SENode *node_00;
  pointer ppSVar5;
  SENode **ppSVar6;
  vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_> new_children;
  SENode *itr;
  SENode **local_68;
  iterator iStack_60;
  SENode **local_58;
  SENode *local_48;
  _Head_base<0UL,_spvtools::opt::SENode_*,_false> local_40;
  SENode *local_38;
  long lVar4;
  
  iVar3 = (*node->_vptr_SENode[6])(node);
  lVar4 = CONCAT44(extraout_var,iVar3);
  if (lVar4 == 0) {
    local_68 = (SENode **)0x0;
    iStack_60._M_current = (SENode **)0x0;
    local_58 = (SENode **)0x0;
    ppSVar5 = (node->children_).
              super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppSVar1 = (node->children_).
              super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (ppSVar5 != ppSVar1) {
      do {
        local_48 = *ppSVar5;
        iVar3 = (*local_48->_vptr_SENode[6])();
        lVar4 = CONCAT44(extraout_var_00,iVar3);
        if ((lVar4 == 0) || (*(Loop **)(lVar4 + 0x40) != loop)) {
          if (iStack_60._M_current == local_58) {
            std::vector<spvtools::opt::SENode*,std::allocator<spvtools::opt::SENode*>>::
            _M_realloc_insert<spvtools::opt::SENode*const&>
                      ((vector<spvtools::opt::SENode*,std::allocator<spvtools::opt::SENode*>> *)
                       &local_68,iStack_60,&local_48);
          }
          else {
            *iStack_60._M_current = local_48;
            iStack_60._M_current = iStack_60._M_current + 1;
          }
        }
        else {
          local_38 = *(SENode **)(lVar4 + 0x38);
          std::vector<spvtools::opt::SENode*,std::allocator<spvtools::opt::SENode*>>::
          emplace_back<spvtools::opt::SENode*>
                    ((vector<spvtools::opt::SENode*,std::allocator<spvtools::opt::SENode*>> *)
                     &local_68,&local_38);
        }
        ppSVar5 = ppSVar5 + 1;
      } while (ppSVar5 != ppSVar1);
    }
    iVar2._M_current = iStack_60._M_current;
    ppSVar6 = local_68;
    local_40._M_head_impl = (SENode *)operator_new(0x30);
    ((local_40._M_head_impl)->children_).
    super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    ((local_40._M_head_impl)->children_).
    super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    ((local_40._M_head_impl)->children_).
    super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (local_40._M_head_impl)->parent_analysis_ = this;
    SENode::NumberOfNodes = SENode::NumberOfNodes + 1;
    (local_40._M_head_impl)->unique_id_ = SENode::NumberOfNodes;
    (local_40._M_head_impl)->_vptr_SENode = (_func_int **)&PTR_GetType_00939e28;
    for (; ppSVar6 != iVar2._M_current; ppSVar6 = ppSVar6 + 1) {
      (*(local_40._M_head_impl)->_vptr_SENode[3])(local_40._M_head_impl,*ppSVar6);
    }
    node_00 = GetCachedOrAdd(this,(unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>
                                   *)&local_40);
    node = SimplifyExpression(this,node_00);
    if (local_40._M_head_impl != (SENode *)0x0) {
      (*(local_40._M_head_impl)->_vptr_SENode[2])();
    }
    local_40._M_head_impl = (SENode *)0x0;
    if (local_68 != (SENode **)0x0) {
      operator_delete(local_68,(long)local_58 - (long)local_68);
    }
  }
  else if (*(Loop **)(lVar4 + 0x40) == loop) {
    node = *(SENode **)(lVar4 + 0x38);
  }
  return node;
}

Assistant:

SENode* ScalarEvolutionAnalysis::BuildGraphWithoutRecurrentTerm(
    SENode* node, const Loop* loop) {
  // If the node is already a recurrent expression belonging to loop then just
  // return the offset.
  SERecurrentNode* recurrent = node->AsSERecurrentNode();
  if (recurrent) {
    if (recurrent->GetLoop() == loop) {
      return recurrent->GetOffset();
    } else {
      return node;
    }
  }

  std::vector<SENode*> new_children;
  // Otherwise find the recurrent node in the children of this node.
  for (auto itr : *node) {
    recurrent = itr->AsSERecurrentNode();
    if (recurrent && recurrent->GetLoop() == loop) {
      new_children.push_back(recurrent->GetOffset());
    } else {
      new_children.push_back(itr);
    }
  }

  std::unique_ptr<SENode> add_node{new SEAddNode(this)};
  for (SENode* child : new_children) {
    add_node->AddChild(child);
  }

  return SimplifyExpression(GetCachedOrAdd(std::move(add_node)));
}